

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTWave_Pause(FACTWave *pWave,int32_t fPause)

{
  uint uVar1;
  
  if (pWave != (FACTWave *)0x0) {
    FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
    uVar1 = pWave->state;
    if ((uVar1 & 0x30) == 0) {
      if (fPause == 0) {
        pWave->state = uVar1 & 0xffffff8f;
        FAudioSourceVoice_Start(pWave->voice,0,0);
      }
      else {
        pWave->state = uVar1 | 0x40;
        FAudioSourceVoice_Stop(pWave->voice,0,0);
      }
    }
    FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTWave_Pause(FACTWave *pWave, int32_t fPause)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	/* FIXME: Does the Cue STOPPING/STOPPED rule apply here too? */
	if (pWave->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))
	{
		FAudio_PlatformUnlockMutex(
			pWave->parentBank->parentEngine->apiLock
		);
		return 0;
	}

	/* All we do is set the flag, the mixer handles the rest */
	if (fPause)
	{
		pWave->state |= FACT_STATE_PAUSED;
		FAudioSourceVoice_Stop(pWave->voice, 0, 0);
	}
	else
	{
		pWave->state &= ~FACT_STATE_PAUSED;
		FAudioSourceVoice_Start(pWave->voice, 0, 0);
	}

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}